

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode HelAckHandshake(UA_Client *client)

{
  UA_Connection *connection;
  UA_Byte **ppUVar1;
  UA_Byte *pUVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  char *msg;
  UA_Logger logger;
  undefined1 local_a8 [8];
  UA_TcpHelloMessage hello;
  size_t offset;
  UA_Byte *pUStack_70;
  UA_UInt32 local_64;
  uint local_60;
  UA_TcpAcknowledgeMessage ackMessage;
  UA_ByteString message;
  UA_TcpMessageHeader messageHeader;
  UA_Boolean realloced;
  
  connection = &client->connection;
  UVar3 = (*(client->connection).getSendBuffer)
                    (connection,0x2000,(UA_ByteString *)&ackMessage.maxMessageSize);
  if (UVar3 == 0) {
    UA_String_copy(&client->endpointUrl,(UA_String *)&hello.maxChunkCount);
    hello.sendBufferSize = (client->connection).localConf.maxChunkCount;
    hello.receiveBufferSize = (client->connection).localConf.maxMessageSize;
    local_a8._0_4_ = (client->connection).localConf.protocolVersion;
    local_a8._4_4_ = (client->connection).localConf.recvBufferSize;
    hello.protocolVersion = (client->connection).localConf.sendBufferSize;
    ppUVar1 = &hello.endpointUrl.data;
    hello.endpointUrl.data = (UA_Byte *)0x8;
    UVar4 = UA_encodeBinary((UA_TcpHelloMessage *)local_a8,UA_TRANSPORT + 2,
                            (UA_exchangeEncodeBuffer)0x0,(void *)0x0,
                            (UA_ByteString *)&ackMessage.maxMessageSize,(size_t *)ppUVar1);
    UA_TcpHelloMessage_deleteMembers((UA_TcpHelloMessage *)local_a8);
    pUVar2 = hello.endpointUrl.data;
    message.data._4_4_ = 0x464c4548;
    hello.endpointUrl.data = (UA_Byte *)0x0;
    UVar3 = UA_TcpMessageHeader_encodeBinary
                      ((UA_TcpMessageHeader *)((long)&message.data + 4),
                       (UA_ByteString *)&ackMessage.maxMessageSize,(size_t *)ppUVar1);
    UVar3 = UVar3 | UVar4;
    if (UVar3 == 0) {
      ackMessage._12_8_ = (ulong)pUVar2 & 0xffffffff;
      UVar3 = (*(client->connection).send)(connection,(UA_ByteString *)&ackMessage.maxMessageSize);
      if (UVar3 == 0) {
        offset = 0;
        pUStack_70 = (UA_Byte *)0x0;
        messageHeader.messageTypeAndChunkType._3_1_ = '\0';
        UVar3 = UA_Connection_receiveChunksBlocking
                          (connection,(UA_ByteString *)&offset,
                           (UA_Boolean *)((long)&messageHeader.messageTypeAndChunkType + 3),
                           (client->config).timeout);
        if (UVar3 == 0) {
          ppUVar1 = &hello.endpointUrl.data;
          hello.endpointUrl.data = (UA_Byte *)0x0;
          UVar4 = UA_TcpMessageHeader_decodeBinary
                            ((UA_ByteString *)&offset,(size_t *)ppUVar1,
                             (UA_TcpMessageHeader *)((long)&message.data + 4));
          UVar3 = UA_decodeBinary((UA_ByteString *)&offset,(size_t *)ppUVar1,&local_64,
                                  UA_TRANSPORT + 6);
          UVar3 = UVar3 | UVar4;
          if (messageHeader.messageTypeAndChunkType._3_1_ == '\0') {
            (*(client->connection).releaseRecvBuffer)(connection,(UA_ByteString *)&offset);
          }
          else {
            UA_ByteString_deleteMembers((UA_ByteString *)&offset);
          }
          if (UVar3 == 0) {
            (client->connection).remoteConf.maxChunkCount = ackMessage.sendBufferSize;
            (client->connection).remoteConf.maxMessageSize = ackMessage.receiveBufferSize;
            (client->connection).remoteConf.protocolVersion = local_64;
            (client->connection).remoteConf.sendBufferSize = ackMessage.protocolVersion;
            (client->connection).remoteConf.recvBufferSize = local_60;
            if (local_60 < (client->connection).localConf.sendBufferSize) {
              (client->connection).localConf.sendBufferSize = local_60;
            }
            if (ackMessage.protocolVersion < (client->connection).localConf.recvBufferSize) {
              (client->connection).localConf.recvBufferSize = ackMessage.protocolVersion;
            }
            connection->state = UA_CONNECTION_ESTABLISHED;
            return 0;
          }
          logger = (client->config).logger;
          msg = "Decoding ACK message failed";
        }
        else {
          logger = (client->config).logger;
          msg = "Receiving ACK message failed";
        }
      }
      else {
        logger = (client->config).logger;
        msg = "Sending HEL failed";
      }
      UA_LOG_INFO(logger,UA_LOGCATEGORY_NETWORK,msg);
    }
    else {
      (*(client->connection).releaseSendBuffer)
                (connection,(UA_ByteString *)&ackMessage.maxMessageSize);
    }
  }
  return UVar3;
}

Assistant:

static UA_StatusCode
HelAckHandshake(UA_Client *client) {
    /* Get a buffer */
    UA_ByteString message;
    UA_Connection *conn = &client->connection;
    UA_StatusCode retval = conn->getSendBuffer(conn, UA_MINMESSAGESIZE, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Prepare the HEL message and encode at offset 8 */
    UA_TcpHelloMessage hello;
    UA_String_copy(&client->endpointUrl, &hello.endpointUrl); /* must be less than 4096 bytes */
    hello.maxChunkCount = conn->localConf.maxChunkCount;
    hello.maxMessageSize = conn->localConf.maxMessageSize;
    hello.protocolVersion = conn->localConf.protocolVersion;
    hello.receiveBufferSize = conn->localConf.recvBufferSize;
    hello.sendBufferSize = conn->localConf.sendBufferSize;

    size_t offset = 8;
    retval = UA_TcpHelloMessage_encodeBinary(&hello, &message, &offset);
    UA_TcpHelloMessage_deleteMembers(&hello);

    /* Encode the message header at offset 0 */
    UA_TcpMessageHeader messageHeader;
    messageHeader.messageTypeAndChunkType = UA_CHUNKTYPE_FINAL + UA_MESSAGETYPE_HEL;
    messageHeader.messageSize = (UA_UInt32)offset;
    offset = 0;
    retval |= UA_TcpMessageHeader_encodeBinary(&messageHeader, &message, &offset);
    if(retval != UA_STATUSCODE_GOOD) {
        conn->releaseSendBuffer(conn, &message);
        return retval;
    }

    /* Send the HEL message */
    message.length = messageHeader.messageSize;
    retval = conn->send(conn, &message);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_NETWORK,
                    "Sending HEL failed");
        return retval;
    }
    UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_NETWORK,
                 "Sent HEL message");

    /* Loop until we have a complete chunk */
    UA_ByteString reply = UA_BYTESTRING_NULL;
    UA_Boolean realloced = false;
    retval = UA_Connection_receiveChunksBlocking(conn, &reply, &realloced,
                                                 client->config.timeout);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_NETWORK,
                    "Receiving ACK message failed");
        return retval;
    }

    /* Decode the message */
    offset = 0;
    UA_TcpAcknowledgeMessage ackMessage;
    retval = UA_TcpMessageHeader_decodeBinary(&reply, &offset, &messageHeader);
    retval |= UA_TcpAcknowledgeMessage_decodeBinary(&reply, &offset, &ackMessage);

    /* Free the message buffer */
    if(!realloced)
        conn->releaseRecvBuffer(conn, &reply);
    else
        UA_ByteString_deleteMembers(&reply);

    /* Store remote connection settings and adjust local configuration to not
       exceed the limits */
    if(retval == UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_NETWORK, "Received ACK message");
        conn->remoteConf.maxChunkCount = ackMessage.maxChunkCount; /* may be zero -> unlimited */
        conn->remoteConf.maxMessageSize = ackMessage.maxMessageSize; /* may be zero -> unlimited */
        conn->remoteConf.protocolVersion = ackMessage.protocolVersion;
        conn->remoteConf.sendBufferSize = ackMessage.sendBufferSize;
        conn->remoteConf.recvBufferSize = ackMessage.receiveBufferSize;
        if(conn->remoteConf.recvBufferSize < conn->localConf.sendBufferSize)
            conn->localConf.sendBufferSize = conn->remoteConf.recvBufferSize;
        if(conn->remoteConf.sendBufferSize < conn->localConf.recvBufferSize)
            conn->localConf.recvBufferSize = conn->remoteConf.sendBufferSize;
        conn->state = UA_CONNECTION_ESTABLISHED;
    } else {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_NETWORK, "Decoding ACK message failed");
    }
    UA_TcpAcknowledgeMessage_deleteMembers(&ackMessage);

    return retval;
}